

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

IdentifierList * __thiscall
Parser::identifierList_abi_cxx11_(IdentifierList *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  Token local_a0;
  Token local_68;
  undefined1 local_19;
  Parser *local_18;
  Parser *this_local;
  IdentifierList *identList;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  bVar1 = match(this,RightParen);
  if (!bVar1) {
    token(&local_68,this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_68.lexeme);
    Token::~Token(&local_68);
    consume(this,Identifier,"identifier");
    while (bVar1 = match(this,Comma), bVar1) {
      consume(this);
      token(&local_a0,this);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_a0.lexeme);
      Token::~Token(&local_a0);
      consume(this,Identifier,"identifier");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IdentifierList Parser::identifierList() {
    IdentifierList identList;

    if(match(TokenType::RightParen))
        return identList;

    identList.push_back(token().lexeme);
    consume(TokenType::Identifier, "identifier");

    while(match(TokenType::Comma)) {
        consume();
        identList.push_back(token().lexeme);
        consume(TokenType::Identifier, "identifier");
    }

    return identList;
}